

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

bool __thiscall
VulkanHppGenerator::checkEquivalentSingularConstructor
          (VulkanHppGenerator *this,
          vector<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>_>
          *constructorIts,const_iterator constructorIt,const_iterator lenIt)

{
  pointer p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  __type_conflict _Var4;
  pointer p_Var5;
  _Base_ptr p_Var6;
  long lVar7;
  ulong uVar8;
  _Base_ptr p_Var9;
  ulong uVar10;
  long lVar11;
  
  p_Var1 = (constructorIts->
           super__Vector_base<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (p_Var5 = (constructorIts->
                super__Vector_base<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; p_Var5 != p_Var1; p_Var5 = p_Var5 + 1) {
    p_Var2 = p_Var5->_M_node;
    p_Var9 = p_Var2[5]._M_parent;
    p_Var6 = p_Var2[5]._M_left;
    p_Var3 = constructorIt._M_node[5]._M_parent;
    if (((long)p_Var6 - (long)p_Var9) / 0x108 + 1 ==
        ((long)constructorIt._M_node[5]._M_left - (long)p_Var3) / 0x108) {
      lVar11 = 0x20;
      uVar10 = 0;
      uVar8 = 0;
      while( true ) {
        if ((ulong)(((long)p_Var6 - (long)p_Var9) / 0x108) <= uVar10) goto LAB_00121896;
        if ((ulong)(((long)constructorIt._M_node[5]._M_left -
                    (long)constructorIt._M_node[5]._M_parent) / 0x108) <= uVar8) {
          __assert_fail("j < constructorIt->second.params.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x3b5,
                        "auto VulkanHppGenerator::checkEquivalentSingularConstructor(const std::vector<std::map<std::string, CommandData>::const_iterator> &, std::map<std::string, CommandData>::const_iterator, std::vector<ParamData>::const_iterator)::(anonymous class)::operator()(std::map<std::string, CommandData>::const_iterator) const"
                       );
        }
        lVar7 = (uVar8 == ((long)lenIt._M_current - (long)p_Var3) / 0x108) + uVar8;
        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&p_Var9->_M_color + lVar11),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)constructorIt._M_node[5]._M_parent + lVar7 * 0x108 + 0x20));
        if (!_Var4) break;
        uVar10 = uVar10 + 1;
        uVar8 = lVar7 + 1;
        p_Var9 = p_Var2[5]._M_parent;
        p_Var6 = p_Var2[5]._M_left;
        lVar11 = lVar11 + 0x108;
      }
    }
  }
LAB_00121896:
  return p_Var5 != p_Var1;
}

Assistant:

bool VulkanHppGenerator::checkEquivalentSingularConstructor( std::vector<std::map<std::string, CommandData>::const_iterator> const & constructorIts,
                                                             std::map<std::string, CommandData>::const_iterator                      constructorIt,
                                                             std::vector<ParamData>::const_iterator                                  lenIt ) const
{
  // check, if there is no singular constructor with the very same arguments as this array constructor
  // (besides the size, of course)
  auto isEquivalentSingularConstructor = [constructorIt, lenIt]( std::map<std::string, CommandData>::const_iterator it )
  {
    if ( it->second.params.size() + 1 != constructorIt->second.params.size() )
    {
      return false;
    }
    const size_t lenIdx = std::distance( constructorIt->second.params.begin(), lenIt );
    for ( size_t i = 0, j = 0; i < it->second.params.size(); ++i, ++j )
    {
      assert( j < constructorIt->second.params.size() );
      if ( j == lenIdx )
      {
        ++j;
      }
      if ( it->second.params[i].type.type != constructorIt->second.params[j].type.type )
      {
        return false;
      }
    }
    return true;
  };
  return ( std::ranges::any_of( constructorIts, isEquivalentSingularConstructor ) );
}